

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

void __thiscall
axl::sl::ArrayRef<axl::io::SockAddr,_axl::sl::ArrayDetails<axl::io::SockAddr>_>::release
          (ArrayRef<axl::io::SockAddr,_axl::sl::ArrayDetails<axl::io::SockAddr>_> *this)

{
  RefCount *in_RDI;
  
  if (in_RDI->m_freeFunc != (FreeFunc *)0x0) {
    rc::RefCount::release(in_RDI);
  }
  initialize((ArrayRef<axl::io::SockAddr,_axl::sl::ArrayDetails<axl::io::SockAddr>_> *)in_RDI);
  return;
}

Assistant:

void
	release() {
		if (m_hdr)
			m_hdr->release();

		initialize();
	}